

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool DataTypeApplyOpFromText
               (char *buf,char *initial_value_buf,ImGuiDataType data_type,void *data_ptr,
               char *format)

{
  bool bVar1;
  int iVar2;
  double *in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  char *in_RDI;
  char *in_R8;
  double arg1f_2;
  double arg0f_1;
  double *v_2;
  float arg1f_1;
  float arg0f;
  float *v_1;
  float arg1f;
  int arg0i;
  int *v;
  int arg1i;
  int data_backup [2];
  char op;
  double local_78;
  double local_70;
  double *local_68;
  float local_60;
  float local_5c;
  double *local_58;
  float local_50;
  float local_4c;
  double *local_48;
  float local_40;
  undefined1 local_3c [11];
  char local_31;
  char *local_30;
  double *local_28;
  int local_1c;
  undefined8 local_18;
  char *local_10;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  while (bVar1 = ImCharIsBlankA(*local_10), bVar1) {
    local_10 = local_10 + 1;
  }
  local_31 = *local_10;
  if (((local_31 == '+') || (local_31 == '*')) || (local_31 == '/')) {
    do {
      local_10 = local_10 + 1;
      bVar1 = ImCharIsBlankA(*local_10);
    } while (bVar1);
  }
  else {
    local_31 = '\0';
  }
  if (*local_10 != '\0') {
    memcpy(local_3c,local_28,GDataTypeInfo[local_1c].Size);
    if (local_30 == (char *)0x0) {
      local_30 = GDataTypeInfo[local_1c].ScanFmt;
    }
    local_40 = 0.0;
    if (local_1c == 0) {
      local_48 = local_28;
      local_4c = *(float *)local_28;
      local_50 = 0.0;
      if ((local_31 != '\0') && (iVar2 = __isoc99_sscanf(local_18,local_30,&local_4c), iVar2 < 1)) {
        return false;
      }
      if (local_31 == '+') {
        iVar2 = __isoc99_sscanf(local_10,"%d",&local_40);
        if (iVar2 != 0) {
          *(int *)local_48 = (int)local_4c + (int)local_40;
        }
      }
      else if (local_31 == '*') {
        iVar2 = __isoc99_sscanf(local_10,"%f",&local_50);
        if (iVar2 != 0) {
          *(int *)local_48 = (int)((float)(int)local_4c * local_50);
        }
      }
      else if (local_31 == '/') {
        iVar2 = __isoc99_sscanf(local_10,"%f",&local_50);
        if ((iVar2 != 0) && ((local_50 != 0.0 || (NAN(local_50))))) {
          *(int *)local_48 = (int)((float)(int)local_4c / local_50);
        }
      }
      else {
        iVar2 = __isoc99_sscanf(local_10,local_30,&local_40);
        if (iVar2 == 1) {
          *(float *)local_48 = local_40;
        }
      }
    }
    else if (((local_1c == 1) || (local_1c == 2)) || (local_1c == 3)) {
      __isoc99_sscanf(local_10,local_30,local_28);
    }
    else if (local_1c == 4) {
      local_30 = "%f";
      local_58 = local_28;
      local_5c = *(float *)local_28;
      local_60 = 0.0;
      if ((local_31 != '\0') && (iVar2 = __isoc99_sscanf(local_18,"%f",&local_5c), iVar2 < 1)) {
        return false;
      }
      iVar2 = __isoc99_sscanf(local_10,local_30,&local_60);
      if (iVar2 < 1) {
        return false;
      }
      if (local_31 == '+') {
        *(float *)local_58 = local_5c + local_60;
      }
      else if (local_31 == '*') {
        *(float *)local_58 = local_5c * local_60;
      }
      else if (local_31 == '/') {
        if ((local_60 != 0.0) || (NAN(local_60))) {
          *(float *)local_58 = local_5c / local_60;
        }
      }
      else {
        *(float *)local_58 = local_60;
      }
    }
    else if (local_1c == 5) {
      local_30 = "%lf";
      local_68 = local_28;
      local_70 = *local_28;
      local_78 = 0.0;
      if ((local_31 != '\0') && (iVar2 = __isoc99_sscanf(local_18,"%lf",&local_70), iVar2 < 1)) {
        return false;
      }
      iVar2 = __isoc99_sscanf(local_10,local_30,&local_78);
      if (iVar2 < 1) {
        return false;
      }
      if (local_31 == '+') {
        *local_68 = local_70 + local_78;
      }
      else if (local_31 == '*') {
        *local_68 = local_70 * local_78;
      }
      else if (local_31 == '/') {
        if ((local_78 != 0.0) || (NAN(local_78))) {
          *local_68 = local_70 / local_78;
        }
      }
      else {
        *local_68 = local_78;
      }
    }
    iVar2 = memcmp(local_3c,local_28,GDataTypeInfo[local_1c].Size);
    return iVar2 != 0;
  }
  return false;
}

Assistant:

static bool DataTypeApplyOpFromText(const char* buf, const char* initial_value_buf, ImGuiDataType data_type, void* data_ptr, const char* format)
{
    while (ImCharIsBlankA(*buf))
        buf++;

    // We don't support '-' op because it would conflict with inputing negative value.
    // Instead you can use +-100 to subtract from an existing value
    char op = buf[0];
    if (op == '+' || op == '*' || op == '/')
    {
        buf++;
        while (ImCharIsBlankA(*buf))
            buf++;
    }
    else
    {
        op = 0;
    }
    if (!buf[0])
        return false;

    // Copy the value in an opaque buffer so we can compare at the end of the function if it changed at all.
    IM_ASSERT(data_type < ImGuiDataType_COUNT);
    int data_backup[2];
    IM_ASSERT(GDataTypeInfo[data_type].Size <= sizeof(data_backup));
    memcpy(data_backup, data_ptr, GDataTypeInfo[data_type].Size);

    if (format == NULL)
        format = GDataTypeInfo[data_type].ScanFmt;

    int arg1i = 0;
    if (data_type == ImGuiDataType_S32)
    {
        int* v = (int*)data_ptr;
        int arg0i = *v;
        float arg1f = 0.0f;
        if (op && sscanf(initial_value_buf, format, &arg0i) < 1)
            return false;
        // Store operand in a float so we can use fractional value for multipliers (*1.1), but constant always parsed as integer so we can fit big integers (e.g. 2000000003) past float precision
        if (op == '+')      { if (sscanf(buf, "%d", &arg1i)) *v = (int)(arg0i + arg1i); }                   // Add (use "+-" to subtract)
        else if (op == '*') { if (sscanf(buf, "%f", &arg1f)) *v = (int)(arg0i * arg1f); }                   // Multiply
        else if (op == '/') { if (sscanf(buf, "%f", &arg1f) && arg1f != 0.0f) *v = (int)(arg0i / arg1f); }  // Divide
        else                { if (sscanf(buf, format, &arg1i) == 1) *v = arg1i; }                           // Assign constant
    }
    else if (data_type == ImGuiDataType_U32 || data_type == ImGuiDataType_S64 || data_type == ImGuiDataType_U64)
    {
        // Assign constant
        // FIXME: We don't bother handling support for legacy operators since they are a little too crappy. Instead we may implement a proper expression evaluator in the future.
        sscanf(buf, format, data_ptr);
    }
    else if (data_type == ImGuiDataType_Float)
    {
        // For floats we have to ignore format with precision (e.g. "%.2f") because sscanf doesn't take them in
        format = "%f";
        float* v = (float*)data_ptr;
        float arg0f = *v, arg1f = 0.0f;
        if (op && sscanf(initial_value_buf, format, &arg0f) < 1)
            return false;
        if (sscanf(buf, format, &arg1f) < 1)
            return false;
        if (op == '+')      { *v = arg0f + arg1f; }                    // Add (use "+-" to subtract)
        else if (op == '*') { *v = arg0f * arg1f; }                    // Multiply
        else if (op == '/') { if (arg1f != 0.0f) *v = arg0f / arg1f; } // Divide
        else                { *v = arg1f; }                            // Assign constant
    }
    else if (data_type == ImGuiDataType_Double)
    {
        format = "%lf"; // scanf differentiate float/double unlike printf which forces everything to double because of ellipsis
        double* v = (double*)data_ptr;
        double arg0f = *v, arg1f = 0.0;
        if (op && sscanf(initial_value_buf, format, &arg0f) < 1)
            return false;
        if (sscanf(buf, format, &arg1f) < 1)
            return false;
        if (op == '+')      { *v = arg0f + arg1f; }                    // Add (use "+-" to subtract)
        else if (op == '*') { *v = arg0f * arg1f; }                    // Multiply
        else if (op == '/') { if (arg1f != 0.0f) *v = arg0f / arg1f; } // Divide
        else                { *v = arg1f; }                            // Assign constant
    }
    return memcmp(data_backup, data_ptr, GDataTypeInfo[data_type].Size) != 0;
}